

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_verify(secp256k1_gej *a)

{
  long in_RDI;
  bool bVar1;
  int in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  secp256k1_fe_verify((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0))
  ;
  secp256k1_fe_verify((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0))
  ;
  secp256k1_fe_verify((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0))
  ;
  secp256k1_fe_verify_magnitude
            ((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  secp256k1_fe_verify_magnitude
            ((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  secp256k1_fe_verify_magnitude
            ((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  bVar1 = true;
  if (*(int *)(in_RDI + 0x90) != 0) {
    bVar1 = *(int *)(in_RDI + 0x90) == 1;
  }
  if (!bVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/group_impl.h"
            ,0x5e,"test condition failed: a->infinity == 0 || a->infinity == 1");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY(&a->z);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GEJ_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GEJ_Y_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->z, SECP256K1_GEJ_Z_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}